

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConvolution3DLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int value;
  int value_00;
  int value_01;
  int value_02;
  int iVar1;
  bool bVar2;
  bool bVar3;
  WeightParamType WVar4;
  int iVar5;
  Convolution3DLayerParams *pCVar6;
  WeightParams *pWVar7;
  string *psVar8;
  int iVar9;
  int iVar10;
  string err_7;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  WeightParamType local_140;
  int local_13c;
  WeightParams *local_138;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,1);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar2 = Result::good(&r);
  if (bVar2) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
    bVar2 = Result::good(&r);
    if (bVar2) {
      if (this->ndArrayInterpretation == true) {
        std::__cxx11::string::string((string *)&local_50,"Convolution3D",(allocator *)&err_7);
        validateInputOutputRankEquality((Result *)&err,layer,&local_50,&this->blobNameToRank);
        Result::operator=(&r,(Result *)&err);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        std::__cxx11::string::~string((string *)&local_50);
        bVar2 = Result::good(&r);
        if (bVar2) {
          std::__cxx11::string::string((string *)&err_7,"Convolution3D",(allocator *)&local_160);
          validateRankCount((Result *)&err,layer,&err_7,5,-1,&this->blobNameToRank);
          Result::operator=(&r,(Result *)&err);
          std::__cxx11::string::~string((string *)&err._M_string_length);
          std::__cxx11::string::~string((string *)&err_7);
          bVar2 = Result::good(&r);
          if (bVar2) goto LAB_0058d7bb;
        }
      }
      else {
LAB_0058d7bb:
        pCVar6 = Specification::NeuralNetworkLayer::convolution3d(layer);
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ != 1) {
          std::operator+(&err_7,"Convolution3D layer: \'",(layer->name_).ptr_);
          std::operator+(&err,&err_7,"\', convolution3D does not support weight as input tensor.");
          std::__cxx11::string::~string((string *)&err_7);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
          goto LAB_0058de40;
        }
        local_13c = pCVar6->outputchannels_;
        iVar10 = pCVar6->inputchannels_;
        value = pCVar6->ngroups_;
        std::__cxx11::string::string((string *)&err_7,"Input Channels",(allocator *)&local_160);
        validatePositive((Result *)&err,iVar10,&err_7);
        Result::operator=(&r,(Result *)&err);
        std::__cxx11::string::~string((string *)&err._M_string_length);
        std::__cxx11::string::~string((string *)&err_7);
        bVar2 = Result::good(&r);
        if (bVar2) {
          std::__cxx11::string::string((string *)&err_7,"Output Channels",(allocator *)&local_160);
          validatePositive((Result *)&err,local_13c,&err_7);
          Result::operator=(&r,(Result *)&err);
          std::__cxx11::string::~string((string *)&err._M_string_length);
          std::__cxx11::string::~string((string *)&err_7);
          bVar2 = Result::good(&r);
          if (bVar2) {
            std::__cxx11::string::string((string *)&err_7,"Groups",(allocator *)&local_160);
            validatePositive((Result *)&err,value,&err_7);
            Result::operator=(&r,(Result *)&err);
            std::__cxx11::string::~string((string *)&err._M_string_length);
            std::__cxx11::string::~string((string *)&err_7);
            bVar2 = Result::good(&r);
            if (bVar2) {
              value_00 = pCVar6->kerneldepth_;
              value_01 = pCVar6->kernelheight_;
              value_02 = pCVar6->kernelwidth_;
              std::__cxx11::string::string((string *)&err_7,"Kernel Depth",(allocator *)&local_160);
              validatePositive((Result *)&err,value_00,&err_7);
              Result::operator=(&r,(Result *)&err);
              std::__cxx11::string::~string((string *)&err._M_string_length);
              std::__cxx11::string::~string((string *)&err_7);
              bVar2 = Result::good(&r);
              if (bVar2) {
                std::__cxx11::string::string
                          ((string *)&err_7,"Kernel Height",(allocator *)&local_160);
                validatePositive((Result *)&err,value_01,&err_7);
                Result::operator=(&r,(Result *)&err);
                std::__cxx11::string::~string((string *)&err._M_string_length);
                std::__cxx11::string::~string((string *)&err_7);
                bVar2 = Result::good(&r);
                if (bVar2) {
                  std::__cxx11::string::string
                            ((string *)&err_7,"Kernel Width",(allocator *)&local_160);
                  validatePositive((Result *)&err,value_02,&err_7);
                  Result::operator=(&r,(Result *)&err);
                  std::__cxx11::string::~string((string *)&err._M_string_length);
                  std::__cxx11::string::~string((string *)&err_7);
                  bVar2 = Result::good(&r);
                  if (bVar2) {
                    iVar1 = pCVar6->stridedepth_;
                    std::__cxx11::string::string
                              ((string *)&err_7,"Stride Depth",(allocator *)&local_160);
                    validatePositive((Result *)&err,iVar1,&err_7);
                    Result::operator=(&r,(Result *)&err);
                    std::__cxx11::string::~string((string *)&err._M_string_length);
                    std::__cxx11::string::~string((string *)&err_7);
                    bVar2 = Result::good(&r);
                    if (bVar2) {
                      iVar1 = pCVar6->strideheight_;
                      std::__cxx11::string::string
                                ((string *)&err_7,"Stride Height",(allocator *)&local_160);
                      validatePositive((Result *)&err,iVar1,&err_7);
                      Result::operator=(&r,(Result *)&err);
                      std::__cxx11::string::~string((string *)&err._M_string_length);
                      std::__cxx11::string::~string((string *)&err_7);
                      bVar2 = Result::good(&r);
                      if (bVar2) {
                        iVar1 = pCVar6->stridewidth_;
                        std::__cxx11::string::string
                                  ((string *)&err_7,"Stride Width",(allocator *)&local_160);
                        validatePositive((Result *)&err,iVar1,&err_7);
                        Result::operator=(&r,(Result *)&err);
                        std::__cxx11::string::~string((string *)&err._M_string_length);
                        std::__cxx11::string::~string((string *)&err_7);
                        bVar2 = Result::good(&r);
                        if (bVar2) {
                          iVar1 = pCVar6->dilationdepth_;
                          std::__cxx11::string::string
                                    ((string *)&err_7,"Dilation Depth",(allocator *)&local_160);
                          validatePositive((Result *)&err,iVar1,&err_7);
                          Result::operator=(&r,(Result *)&err);
                          std::__cxx11::string::~string((string *)&err._M_string_length);
                          std::__cxx11::string::~string((string *)&err_7);
                          bVar2 = Result::good(&r);
                          if (bVar2) {
                            iVar1 = pCVar6->dilationheight_;
                            std::__cxx11::string::string
                                      ((string *)&err_7,"Dilation Height",(allocator *)&local_160);
                            validatePositive((Result *)&err,iVar1,&err_7);
                            Result::operator=(&r,(Result *)&err);
                            std::__cxx11::string::~string((string *)&err._M_string_length);
                            std::__cxx11::string::~string((string *)&err_7);
                            bVar2 = Result::good(&r);
                            if (bVar2) {
                              iVar1 = pCVar6->dilationwidth_;
                              std::__cxx11::string::string
                                        ((string *)&err_7,"Dilation Width",(allocator *)&local_160);
                              validatePositive((Result *)&err,iVar1,&err_7);
                              Result::operator=(&r,(Result *)&err);
                              std::__cxx11::string::~string((string *)&err._M_string_length);
                              std::__cxx11::string::~string((string *)&err_7);
                              bVar2 = Result::good(&r);
                              if (bVar2) {
                                if (pCVar6->custompaddingfront_ < 0) {
                                  std::__cxx11::to_string(&local_160,pCVar6->custompaddingfront_);
                                  std::operator+(&err_7,
                                                 "Custom Padding Front must be non-negative, got \'"
                                                 ,&local_160);
                                  std::operator+(&err,&err_7,"\'.");
                                  std::__cxx11::string::~string((string *)&err_7);
                                  std::__cxx11::string::~string((string *)&local_160);
                                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                 &err);
LAB_0058de40:
                                  psVar8 = &err;
                                }
                                else {
                                  if (pCVar6->custompaddingback_ < 0) {
                                    std::__cxx11::to_string(&local_160,pCVar6->custompaddingback_);
                                    std::operator+(&err_7,
                                                  "Custom Padding Back must be non-negative, got \'"
                                                  ,&local_160);
                                    std::operator+(&err,&err_7,"\'.");
                                    std::__cxx11::string::~string((string *)&err_7);
                                    std::__cxx11::string::~string((string *)&local_160);
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   &err);
                                    goto LAB_0058de40;
                                  }
                                  if (pCVar6->custompaddingtop_ < 0) {
                                    std::__cxx11::to_string(&local_160,pCVar6->custompaddingtop_);
                                    std::operator+(&err_7,
                                                  "Custom Padding Top must be non-negative, got \'",
                                                  &local_160);
                                    std::operator+(&err,&err_7,"\'.");
                                    std::__cxx11::string::~string((string *)&err_7);
                                    std::__cxx11::string::~string((string *)&local_160);
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   &err);
                                    goto LAB_0058de40;
                                  }
                                  if (pCVar6->custompaddingbottom_ < 0) {
                                    std::__cxx11::to_string(&local_160,pCVar6->custompaddingbottom_)
                                    ;
                                    std::operator+(&err_7,
                                                  "Custom Padding Bottom must be non-negative, got \'"
                                                  ,&local_160);
                                    std::operator+(&err,&err_7,"\'.");
                                    std::__cxx11::string::~string((string *)&err_7);
                                    std::__cxx11::string::~string((string *)&local_160);
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   &err);
                                    goto LAB_0058de40;
                                  }
                                  if (pCVar6->custompaddingleft_ < 0) {
                                    std::__cxx11::to_string(&local_160,pCVar6->custompaddingleft_);
                                    std::operator+(&err_7,
                                                  "customPadding Left must be non-negative, got \'",
                                                  &local_160);
                                    std::operator+(&err,&err_7,"\'.");
                                    std::__cxx11::string::~string((string *)&err_7);
                                    std::__cxx11::string::~string((string *)&local_160);
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   &err);
                                    goto LAB_0058de40;
                                  }
                                  if (pCVar6->custompaddingright_ < 0) {
                                    std::__cxx11::to_string(&local_160,pCVar6->custompaddingright_);
                                    std::operator+(&err_7,
                                                  "customPadding Right must be non-negative, got \'"
                                                  ,&local_160);
                                    std::operator+(&err,&err_7,"\'.");
                                    std::__cxx11::string::~string((string *)&err_7);
                                    std::__cxx11::string::~string((string *)&local_160);
                                    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                                                   &err);
                                    goto LAB_0058de40;
                                  }
                                  pWVar7 = pCVar6->weights_;
                                  if (pWVar7 == (WeightParams *)0x0) {
                                    pWVar7 = (WeightParams *)
                                             &Specification::_WeightParams_default_instance_;
                                  }
                                  WVar4 = valueType(pWVar7);
                                  local_138 = (WeightParams *)CONCAT44(local_138._4_4_,WVar4);
                                  pWVar7 = pCVar6->bias_;
                                  if (pWVar7 == (WeightParams *)0x0) {
                                    pWVar7 = (WeightParams *)
                                             &Specification::_WeightParams_default_instance_;
                                  }
                                  local_140 = valueType(pWVar7);
                                  if (((int)local_138 == 4) ||
                                     (bVar2 = pCVar6->hasbias_,
                                     (local_140 == UNSPECIFIED & bVar2) != 0)) {
                                    std::operator+(&err,"Convolution3D layer \'",(layer->name_).ptr_
                                                  );
                                    std::operator+(&err_7,&err,
                                                   "\'  has invalid weights/bias fields.");
                                    std::__cxx11::string::~string((string *)&err);
                                    Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_7);
                                    goto LAB_0058e0cd;
                                  }
                                  if ((bVar2 != false) &&
                                     ((((int)local_138 == 1 && (local_140 == FLOAT32)) ||
                                      (((int)local_138 == 0 && (local_140 == FLOAT16)))))) {
                                    std::operator+(&local_160,"Convolution3D layer \'",
                                                   (layer->name_).ptr_);
                                    std::operator+(&err_7,&local_160,
                                                                                                      
                                                  "\' has unmatched precisions of weights/bias They should either be half or full precision."
                                                  );
                                    Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_7);
LAB_0058ddbd:
                                    Result::operator=(&r,(Result *)&err);
                                    std::__cxx11::string::~string((string *)&err._M_string_length);
                                    std::__cxx11::string::~string((string *)&err_7);
                                    std::__cxx11::string::~string((string *)&local_160);
                                    goto LAB_0058e44c;
                                  }
                                  iVar1 = (pCVar6->outputshape_).current_size_;
                                  iVar9 = iVar10;
                                  iVar5 = local_13c;
                                  if (iVar1 != 0) {
                                    if (pCVar6->isdeconvolution_ == false) {
                                      std::operator+(&err_7,"Deconvolution3D Layer \'",
                                                     (layer->name_).ptr_);
                                      std::operator+(&err,&err_7,
                                                                                                          
                                                  "\' Output Shape is supported for Deconvolution layer."
                                                  );
                                      std::__cxx11::string::~string((string *)&err_7);
                                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS
                                                     ,&err);
                                    }
                                    else {
                                      if (iVar1 == 3) {
                                        if ((int)local_138 != 2) goto LAB_0058e205;
                                        goto LAB_0058e13f;
                                      }
                                      std::operator+(&err_7,"Deconvolution3D layer: \'",
                                                     (layer->name_).ptr_);
                                      std::operator+(&err,&err_7,
                                                                                                          
                                                  "\' , if set, output shape must be of length 3.");
                                      std::__cxx11::string::~string((string *)&err_7);
                                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS
                                                     ,&err);
                                    }
                                    goto LAB_0058de40;
                                  }
                                  if ((int)local_138 == 2) {
LAB_0058e13f:
                                    std::operator+(&local_160,"Layer \'",(layer->name_).ptr_);
                                    std::operator+(&err,&local_160,
                                                   "\' has invalid weights field. Quantized ");
                                    std::operator+(&err_7,&err,"weights are not supported.");
                                    std::__cxx11::string::~string((string *)&err);
                                    std::__cxx11::string::~string((string *)&local_160);
                                    Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_7);
                                  }
                                  else {
                                    if (pCVar6->isdeconvolution_ == false) {
                                      iVar9 = local_13c;
                                      iVar5 = iVar10;
                                    }
LAB_0058e205:
                                    local_138 = pCVar6->weights_;
                                    if (local_138 == (WeightParams *)0x0) {
                                      local_138 = (WeightParams *)
                                                  &Specification::_WeightParams_default_instance_;
                                    }
                                    std::__cxx11::string::string
                                              ((string *)&err_7,"Convolution3D ",
                                               (allocator *)&local_d0);
                                    psVar8 = (layer->name_).ptr_;
                                    std::__cxx11::string::string
                                              ((string *)&local_160,"weights",(allocator *)&local_f0
                                              );
                                    validateGeneralWeightParams
                                              ((Result *)&err,local_138,
                                               (long)(value_01 * value_00 * value_02 *
                                                     (iVar5 / value) * iVar9),(long)local_13c,&err_7
                                               ,psVar8,&local_160);
                                    Result::operator=(&r,(Result *)&err);
                                    std::__cxx11::string::~string((string *)&err._M_string_length);
                                    std::__cxx11::string::~string((string *)&local_160);
                                    std::__cxx11::string::~string((string *)&err_7);
                                    bVar3 = Result::good(&r);
                                    if ((!bVar3) || (bVar2 == false)) goto LAB_0058e44c;
                                    if (local_140 < QUINT) {
                                      pWVar7 = pCVar6->bias_;
                                      if (pWVar7 == (WeightParams *)0x0) {
                                        pWVar7 = (WeightParams *)
                                                 &Specification::_WeightParams_default_instance_;
                                      }
                                      if (local_140 == FLOAT32) {
                                        iVar10 = (pWVar7->floatvalue_).current_size_;
                                      }
                                      else {
                                        iVar10 = (int)(((pWVar7->float16value_).ptr_)->
                                                       _M_string_length >> 1);
                                      }
                                      if (iVar10 == local_13c) goto LAB_0058e44c;
                                      std::operator+(&local_70,"Convolution3D layer \'",
                                                     (layer->name_).ptr_);
                                      std::operator+(&local_f0,&local_70,
                                                     "\' has a bias vector of size ");
                                      std::__cxx11::to_string(&local_90,iVar10);
                                      std::operator+(&local_d0,&local_f0,&local_90);
                                      std::operator+(&local_160,&local_d0," but should be ");
                                      std::__cxx11::to_string(&local_b0,local_13c);
                                      std::operator+(&err,&local_160,&local_b0);
                                      std::operator+(&err_7,&err,".");
                                      std::__cxx11::string::~string((string *)&err);
                                      std::__cxx11::string::~string((string *)&local_b0);
                                      std::__cxx11::string::~string((string *)&local_160);
                                      std::__cxx11::string::~string((string *)&local_d0);
                                      std::__cxx11::string::~string((string *)&local_90);
                                      std::__cxx11::string::~string((string *)&local_f0);
                                      std::__cxx11::string::~string((string *)&local_70);
                                      Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_7)
                                      ;
                                    }
                                    else {
                                      if (local_140 != QUINT) {
                                        std::operator+(&local_160,"Layer ",(layer->name_).ptr_);
                                        std::operator+(&err_7,&local_160,"has not specified bias.");
                                        Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,
                                                       &err_7);
                                        goto LAB_0058ddbd;
                                      }
                                      std::operator+(&local_160,"Layer \'",(layer->name_).ptr_);
                                      std::operator+(&err,&local_160,
                                                     "\' has invalid bias field. Quantized ");
                                      std::operator+(&err_7,&err,"bias is not supported.");
                                      std::__cxx11::string::~string((string *)&err);
                                      std::__cxx11::string::~string((string *)&local_160);
                                      Result::Result((Result *)&err,INVALID_MODEL_PARAMETERS,&err_7)
                                      ;
                                    }
                                  }
LAB_0058e0cd:
                                  Result::operator=(&r,(Result *)&err);
                                  std::__cxx11::string::~string((string *)&err._M_string_length);
                                  Result::Result(__return_storage_ptr__,&r);
                                  psVar8 = &err_7;
                                }
                                std::__cxx11::string::~string((string *)psVar8);
                                goto LAB_0058e451;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0058e44c:
  Result::Result(__return_storage_ptr__,&r);
LAB_0058e451:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConvolution3DLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) { return r; }

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) { return r; }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Convolution3D", blobNameToRank);
        if (!r.good()) { return r; }
        r = validateRankCount(layer, "Convolution3D", 5, -1, blobNameToRank);
        if (!r.good()) { return r; }
    }

    const auto& params = layer.convolution3d();

    if (layer.input_size() != 1) {
        std::string err = "Convolution3D layer: '" + layer.name() +
            "', convolution3D does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Validate input and output channels and number of convolution groups are positive
    int inputChannels = params.inputchannels();
    int outputChannels = params.outputchannels();
    int nGroups = params.ngroups();
    r = validatePositive(inputChannels, "Input Channels");
    if (!r.good()) { return r; }
    r = validatePositive(outputChannels, "Output Channels");
    if (!r.good()) { return r; }
    r = validatePositive(nGroups, "Groups");
    if (!r.good()) { return r; }

    // Validate kernel is positive
    int kernelDepth = params.kerneldepth();
    int kernelHeight = params.kernelheight();
    int kernelWidth = params.kernelwidth();
    r = validatePositive(kernelDepth, "Kernel Depth");
    if (!r.good()) { return r; }
    r = validatePositive(kernelHeight, "Kernel Height");
    if (!r.good()) { return r; }
    r = validatePositive(kernelWidth, "Kernel Width");
    if (!r.good()) { return r; }

    // Validate stride is positive
    r = validatePositive(params.stridedepth(), "Stride Depth");
    if (!r.good()) { return r; }
    r = validatePositive(params.strideheight(), "Stride Height");
    if (!r.good()) { return r; }
    r = validatePositive(params.stridewidth(), "Stride Width");
    if (!r.good()) { return r; }

    // Validate dilation is positive
    r = validatePositive(params.dilationdepth(), "Dilation Depth");
    if (!r.good()) { return r; }
    r = validatePositive(params.dilationheight(), "Dilation Height");
    if (!r.good()) { return r; }
    r = validatePositive(params.dilationwidth(), "Dilation Width");
    if (!r.good()) { return r; }

    // Validate padding
    int customPaddingFront = params.custompaddingfront();
    int customPaddingBack = params.custompaddingback();
    int customPaddingTop = params.custompaddingtop();
    int customPaddingBottom = params.custompaddingbottom();
    int customPaddingLeft = params.custompaddingleft();
    int customPaddingRight = params.custompaddingright();
    if (customPaddingFront < 0) {
        std::string err = "Custom Padding Front must be non-negative, got '" +
            std::to_string(customPaddingFront) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingBack < 0) {
        std::string err = "Custom Padding Back must be non-negative, got '" +
            std::to_string(customPaddingBack) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingTop < 0) {
        std::string err = "Custom Padding Top must be non-negative, got '" +
            std::to_string(customPaddingTop) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingBottom < 0) {
        std::string err = "Custom Padding Bottom must be non-negative, got '" +
            std::to_string(customPaddingBottom) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingLeft < 0) {
        std::string err = "customPadding Left must be non-negative, got '" +
            std::to_string(customPaddingLeft) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (customPaddingRight < 0) {
        std::string err = "customPadding Right must be non-negative, got '" +
            std::to_string(customPaddingRight) + "'.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(params.weights());
    biasValueType = valueType(params.bias());
    bool has_bias = params.hasbias();

    // Check weight/bias value types. Only float32 or float16 parameters can be populated at any time
    if ((weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Convolution3D layer '" + layer.name() +
            "'  has invalid weights/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)) {
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Convolution3D layer '" + layer.name() +
                "' has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    bool is_deconv = params.isdeconvolution();

    if (params.outputshape_size() != 0) {
        if (!is_deconv) {
            std::string err = "Deconvolution3D Layer '" + layer.name() + "' Output Shape is supported for Deconvolution layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        } else if (params.outputshape_size() != 3) {
            std::string err = "Deconvolution3D layer: '" + layer.name() + "' , if set, output shape must be of length 3.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    // Manually check if weights are quantized--we don't currently support them and
    // `validateGeneralWeightParams` allows them
    if (weightsValueType == QUINT) {
        std::string err = "Layer '" + layer.name() + "' has invalid weights field. Quantized " +
            "weights are not supported.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    uint64_t expected_weight_size = 0;
    if (is_deconv) {
        expected_weight_size = static_cast<uint64_t>((outputChannels / nGroups) * inputChannels * kernelDepth * kernelHeight * kernelWidth);
    } else {
        expected_weight_size = static_cast<uint64_t>(outputChannels * (inputChannels / nGroups) * kernelDepth * kernelHeight * kernelWidth);
    }
    r = validateGeneralWeightParams(params.weights(), expected_weight_size, uint64_t(outputChannels),
                                    "Convolution3D ", layer.name(), "weights");
    if (!r.good()) { return r; }

    // Check the bias
    int bias_size = 0;
    if (has_bias) {
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = params.bias().floatvalue().size();
            } else {
                bias_size = int(params.bias().float16value().size() / 2);
            }
            if (bias_size != outputChannels) {
                std::string err = "Convolution3D layer '" + layer.name() +
                    "' has a bias vector of size " + std::to_string(bias_size) + " but should be " +
                    std::to_string(outputChannels) + ".";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            // We don't currently support quantized parameters.
            std::string err = "Layer '" + layer.name() + "' has invalid bias field. Quantized " +
                "bias is not supported.";
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            return r;
        } else { // EMPTY
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() +
                "has not specified bias.");
            return r;
        }
    }
    return r;
}